

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

bool __thiscall
ADSBHubConnection::StreamProcessDataSBSLine(ADSBHubConnection *this,char *pStart,char *pEnd)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  logLevelTy lVar5;
  int iVar6;
  undefined8 uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  time_t ts;
  int ms;
  tm tm;
  FDKeyTy key;
  string token;
  undefined4 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadc;
  undefined1 in_stack_fffffffffffffadd;
  undefined1 in_stack_fffffffffffffade;
  undefined1 in_stack_fffffffffffffadf;
  positionTy *in_stack_fffffffffffffae0;
  char in_stack_fffffffffffffb2f;
  double *in_stack_fffffffffffffb30;
  char **in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  undefined8 in_stack_fffffffffffffb48;
  FDKeyType _eType;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  string local_428 [4];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  time_t local_2a8;
  string local_2a0 [36];
  int local_27c;
  string local_278 [32];
  string local_258 [8];
  ADSBHubConnection *in_stack_fffffffffffffdb0;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  FDKeyTy local_100;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  undefined4 local_50;
  string local_40 [32];
  ulong local_20;
  ulong local_18;
  byte local_1;
  
  _eType = (FDKeyType)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  readToken_abi_cxx11_
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffae0,
                          (char *)CONCAT17(in_stack_fffffffffffffadf,
                                           CONCAT16(in_stack_fffffffffffffade,
                                                    CONCAT15(in_stack_fffffffffffffadd,
                                                             CONCAT14(in_stack_fffffffffffffadc,
                                                                      in_stack_fffffffffffffad8)))))
  ;
  if (bVar2) {
    lVar5 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar5 < 1) {
      uVar7 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x135,"StreamProcessDataSBSLine",logDEBUG,"Ignoring line of type \'%s\'",uVar7);
    }
    local_1 = 0;
    local_50 = 1;
  }
  else {
    readToken_abi_cxx11_
              (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f
              );
    std::__cxx11::string::~string(local_70);
    readToken_abi_cxx11_
              (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f
              );
    std::__cxx11::string::~string(local_90);
    readToken_abi_cxx11_
              (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f
              );
    std::__cxx11::string::~string(local_b0);
    if (local_20 < local_18) {
      lVar5 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar5 < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
               ,0x13d,"StreamProcessDataSBSLine",logERR,
               "Line too short, not even read an ADS-B hex id yet");
      }
      local_1 = 0;
      local_50 = 1;
    }
    else {
      readToken_abi_cxx11_
                (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                 in_stack_fffffffffffffb2f);
      std::__cxx11::string::operator=(local_40,local_d0);
      std::__cxx11::string::~string(local_d0);
      if (local_20 < local_18) {
        lVar5 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar5 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x141,"StreamProcessDataSBSLine",logERR,
                 "Line too short, just only read an ADS-B hex id");
        }
        local_1 = 0;
        local_50 = 1;
      }
      else {
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::__cxx11::string::string(local_120,local_40);
          LTFlightData::FDKeyTy::FDKeyTy
                    ((FDKeyTy *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),_eType
                     ,(string *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                     (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
          std::__cxx11::string::~string(local_120);
          bVar2 = LTFlightData::FDKeyTy::operator!=((FDKeyTy *)(in_RDI + 0x2a0),&local_100);
          if (bVar2) {
            ProcessPlaneData(in_stack_fffffffffffffdb0);
            LTFlightData::FDKeyTy::operator=
                      ((FDKeyTy *)in_stack_fffffffffffffae0,
                       (FDKeyTy *)
                       CONCAT17(in_stack_fffffffffffffadf,
                                CONCAT16(in_stack_fffffffffffffade,
                                         CONCAT15(in_stack_fffffffffffffadd,
                                                  CONCAT14(in_stack_fffffffffffffadc,
                                                           in_stack_fffffffffffffad8)))));
          }
          readToken_abi_cxx11_
                    (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb2f);
          std::__cxx11::string::~string(local_140);
          readToken_abi_cxx11_
                    (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb2f);
          std::__cxx11::string::~string(local_160);
          readToken_abi_cxx11_
                    (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb2f);
          std::__cxx11::string::~string(local_180);
          if (local_20 < local_18) {
            lVar5 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar5 < 4) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                     ,0x153,"StreamProcessDataSBSLine",logERR,
                     "Line too short, not yet read date/time of message created");
            }
            local_1 = 0;
          }
          else {
            uStack_190 = 0;
            local_1a8 = 0;
            uStack_1a0 = 0;
            local_1b8 = 0;
            uStack_1b0 = 0;
            local_188 = 0;
            local_198 = 0xffffffff;
            readToken_abi_cxx11_
                      (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                       in_stack_fffffffffffffb2f);
            iVar6 = std::__cxx11::stoi((string *)in_stack_fffffffffffffae0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffadf,
                                                CONCAT16(in_stack_fffffffffffffade,
                                                         CONCAT15(in_stack_fffffffffffffadd,
                                                                  CONCAT14(in_stack_fffffffffffffadc
                                                                           ,
                                                  in_stack_fffffffffffffad8)))),0);
            local_1a8._4_4_ = iVar6 + -0x76c;
            std::__cxx11::string::~string(local_1d8);
            readToken_abi_cxx11_
                      (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                       in_stack_fffffffffffffb2f);
            iVar6 = std::__cxx11::stoi((string *)in_stack_fffffffffffffae0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffadf,
                                                CONCAT16(in_stack_fffffffffffffade,
                                                         CONCAT15(in_stack_fffffffffffffadd,
                                                                  CONCAT14(in_stack_fffffffffffffadc
                                                                           ,
                                                  in_stack_fffffffffffffad8)))),0);
            local_1a8 = CONCAT44(local_1a8._4_4_,iVar6 + -1);
            std::__cxx11::string::~string(local_1f8);
            readToken_abi_cxx11_
                      (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                       in_stack_fffffffffffffb2f);
            iVar6 = std::__cxx11::stoi((string *)in_stack_fffffffffffffae0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffadf,
                                                CONCAT16(in_stack_fffffffffffffade,
                                                         CONCAT15(in_stack_fffffffffffffadd,
                                                                  CONCAT14(in_stack_fffffffffffffadc
                                                                           ,
                                                  in_stack_fffffffffffffad8)))),0);
            uStack_1b0._4_4_ = iVar6;
            std::__cxx11::string::~string(local_218);
            readToken_abi_cxx11_
                      (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                       in_stack_fffffffffffffb2f);
            iVar6 = std::__cxx11::stoi((string *)in_stack_fffffffffffffae0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffadf,
                                                CONCAT16(in_stack_fffffffffffffade,
                                                         CONCAT15(in_stack_fffffffffffffadd,
                                                                  CONCAT14(in_stack_fffffffffffffadc
                                                                           ,
                                                  in_stack_fffffffffffffad8)))),0);
            uStack_1b0 = CONCAT44(uStack_1b0._4_4_,iVar6);
            std::__cxx11::string::~string(local_238);
            readToken_abi_cxx11_
                      (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                       in_stack_fffffffffffffb2f);
            iVar6 = std::__cxx11::stoi((string *)in_stack_fffffffffffffae0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffadf,
                                                CONCAT16(in_stack_fffffffffffffade,
                                                         CONCAT15(in_stack_fffffffffffffadd,
                                                                  CONCAT14(in_stack_fffffffffffffadc
                                                                           ,
                                                  in_stack_fffffffffffffad8)))),0);
            local_1b8._4_4_ = iVar6;
            std::__cxx11::string::~string(local_258);
            readToken_abi_cxx11_
                      (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                       in_stack_fffffffffffffb2f);
            iVar6 = std::__cxx11::stoi((string *)in_stack_fffffffffffffae0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffadf,
                                                CONCAT16(in_stack_fffffffffffffade,
                                                         CONCAT15(in_stack_fffffffffffffadd,
                                                                  CONCAT14(in_stack_fffffffffffffadc
                                                                           ,
                                                  in_stack_fffffffffffffad8)))),0);
            local_1b8 = CONCAT44(local_1b8._4_4_,iVar6);
            std::__cxx11::string::~string(local_278);
            readToken_abi_cxx11_
                      (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                       in_stack_fffffffffffffb2f);
            iVar6 = std::__cxx11::stoi((string *)in_stack_fffffffffffffae0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffadf,
                                                CONCAT16(in_stack_fffffffffffffade,
                                                         CONCAT15(in_stack_fffffffffffffadd,
                                                                  CONCAT14(in_stack_fffffffffffffadc
                                                                           ,
                                                  in_stack_fffffffffffffad8)))),0);
            std::__cxx11::string::~string(local_2a0);
            local_27c = iVar6;
            if (local_20 < local_18) {
              lVar5 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)lVar5 < 4) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                       ,0x160,"StreamProcessDataSBSLine",logERR,
                       "Line too short, not yet read actual data");
              }
              local_1 = 0;
            }
            else {
              local_2a8 = mktime_utc((tm *)in_stack_fffffffffffffae0);
              dVar1 = (double)local_2a8 + (double)local_27c / 1000.0;
              *(double *)(in_RDI + 0x4a0) = dVar1;
              pdVar9 = positionTy::ts((positionTy *)(in_RDI + 0x4b0));
              *pdVar9 = dVar1;
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                         in_stack_fffffffffffffb2f);
              std::__cxx11::string::operator=(local_40,local_2c8);
              bVar3 = std::__cxx11::string::empty();
              std::__cxx11::string::~string(local_2c8);
              if (((bVar3 ^ 0xff) & 1) != 0) {
                std::__cxx11::string::operator=((string *)(in_RDI + 0x3a8),local_40);
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                         in_stack_fffffffffffffb2f);
              std::__cxx11::string::operator=(local_40,local_2e8);
              bVar3 = std::__cxx11::string::empty();
              std::__cxx11::string::~string(local_2e8);
              if (((bVar3 ^ 0xff) & 1) != 0) {
                std::__cxx11::stod((string *)in_stack_fffffffffffffae0,
                                   (size_t *)
                                   CONCAT17(in_stack_fffffffffffffadf,
                                            CONCAT16(in_stack_fffffffffffffade,
                                                     CONCAT15(in_stack_fffffffffffffadd,
                                                              CONCAT14(in_stack_fffffffffffffadc,
                                                                       in_stack_fffffffffffffad8))))
                                  );
                positionTy::SetAltFt
                          (in_stack_fffffffffffffae0,
                           (double)CONCAT17(in_stack_fffffffffffffadf,
                                            CONCAT16(in_stack_fffffffffffffade,
                                                     CONCAT15(in_stack_fffffffffffffadd,
                                                              CONCAT14(in_stack_fffffffffffffadc,
                                                                       in_stack_fffffffffffffad8))))
                          );
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                         in_stack_fffffffffffffb2f);
              std::__cxx11::string::operator=(local_40,local_308);
              bVar3 = std::__cxx11::string::empty();
              bVar3 = bVar3 ^ 0xff;
              std::__cxx11::string::~string(local_308);
              if ((bVar3 & 1) != 0) {
                dVar1 = std::__cxx11::stod((string *)in_stack_fffffffffffffae0,
                                           (size_t *)
                                           CONCAT17(in_stack_fffffffffffffadf,
                                                    CONCAT16(in_stack_fffffffffffffade,
                                                             CONCAT15(in_stack_fffffffffffffadd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffadc,
                                                  in_stack_fffffffffffffad8)))));
                *(double *)(in_RDI + 0x490) = dVar1;
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                         in_stack_fffffffffffffb2f);
              std::__cxx11::string::operator=(local_40,local_328);
              bVar3 = std::__cxx11::string::empty();
              bVar3 = bVar3 ^ 0xff;
              std::__cxx11::string::~string(local_328);
              if ((bVar3 & 1) != 0) {
                in_stack_fffffffffffffb38 =
                     (char **)std::__cxx11::stod((string *)in_stack_fffffffffffffae0,
                                                 (size_t *)
                                                 CONCAT17(in_stack_fffffffffffffadf,
                                                          CONCAT16(in_stack_fffffffffffffade,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffadd,
                                                  CONCAT14(in_stack_fffffffffffffadc,
                                                           in_stack_fffffffffffffad8)))));
                *(char ***)(in_RDI + 0x488) = in_stack_fffffffffffffb38;
                in_stack_fffffffffffffb30 = positionTy::heading((positionTy *)(in_RDI + 0x4b0));
                *in_stack_fffffffffffffb30 = (double)in_stack_fffffffffffffb38;
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                         in_stack_fffffffffffffb2f);
              std::__cxx11::string::operator=(local_40,local_348);
              bVar3 = std::__cxx11::string::empty();
              bVar3 = bVar3 ^ 0xff;
              std::__cxx11::string::~string(local_348);
              if ((bVar3 & 1) != 0) {
                dVar1 = std::__cxx11::stod((string *)in_stack_fffffffffffffae0,
                                           (size_t *)
                                           CONCAT17(in_stack_fffffffffffffadf,
                                                    CONCAT16(in_stack_fffffffffffffade,
                                                             CONCAT15(in_stack_fffffffffffffadd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffadc,
                                                  in_stack_fffffffffffffad8)))));
                pdVar9 = positionTy::lat((positionTy *)(in_RDI + 0x4b0));
                *pdVar9 = dVar1;
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,bVar3);
              std::__cxx11::string::operator=(local_40,local_368);
              bVar4 = std::__cxx11::string::empty();
              std::__cxx11::string::~string(local_368);
              if (((bVar4 ^ 0xff) & 1) != 0) {
                dVar1 = std::__cxx11::stod((string *)in_stack_fffffffffffffae0,
                                           (size_t *)
                                           CONCAT17(in_stack_fffffffffffffadf,
                                                    CONCAT16(in_stack_fffffffffffffade,
                                                             CONCAT15(in_stack_fffffffffffffadd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffadc,
                                                  in_stack_fffffffffffffad8)))));
                pdVar9 = positionTy::lon((positionTy *)(in_RDI + 0x4b0));
                *pdVar9 = dVar1;
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,bVar3);
              std::__cxx11::string::operator=(local_40,local_388);
              bVar4 = std::__cxx11::string::empty();
              std::__cxx11::string::~string(local_388);
              if (((bVar4 ^ 0xff) & 1) != 0) {
                dVar1 = std::__cxx11::stod((string *)in_stack_fffffffffffffae0,
                                           (size_t *)
                                           CONCAT17(in_stack_fffffffffffffadf,
                                                    CONCAT16(in_stack_fffffffffffffade,
                                                             CONCAT15(in_stack_fffffffffffffadd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffadc,
                                                  in_stack_fffffffffffffad8)))));
                *(double *)(in_RDI + 0x498) = dVar1;
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,bVar3);
              std::__cxx11::string::operator=(local_40,local_3a8);
              bVar4 = std::__cxx11::string::empty();
              std::__cxx11::string::~string(local_3a8);
              if (((bVar4 ^ 0xff) & 1) != 0) {
                in_stack_fffffffffffffae0 =
                     (positionTy *)
                     std::__cxx11::stol((string *)in_stack_fffffffffffffae0,
                                        (size_t *)
                                        CONCAT17(in_stack_fffffffffffffadf,
                                                 CONCAT16(in_stack_fffffffffffffade,
                                                          CONCAT15(in_stack_fffffffffffffadd,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffadc,
                                                  in_stack_fffffffffffffad8)))),0);
                *(positionTy **)(in_RDI + 0x470) = in_stack_fffffffffffffae0;
              }
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,bVar3);
              std::__cxx11::string::~string(local_3c8);
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,bVar3);
              std::__cxx11::string::~string(local_3e8);
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,bVar3);
              std::__cxx11::string::~string(local_408);
              readToken_abi_cxx11_
                        (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,bVar3);
              std::__cxx11::string::operator=(local_40,local_428);
              bVar3 = std::__cxx11::string::empty();
              bVar3 = bVar3 ^ 0xff;
              std::__cxx11::string::~string(local_428);
              if ((bVar3 & 1) != 0) {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffae0,
                                        (char *)CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffade,
                                                                        CONCAT15(
                                                  in_stack_fffffffffffffadd,
                                                  CONCAT14(in_stack_fffffffffffffadc,
                                                           in_stack_fffffffffffffad8)))));
                *(bool *)(in_RDI + 0x480) = bVar2;
                bVar3 = 2;
                if ((*(byte *)(in_RDI + 0x480) & 1) == 0) {
                  bVar3 = 1;
                }
                *(ushort *)(in_RDI + 0x4ec) =
                     *(ushort *)(in_RDI + 0x4ec) & 0xfcff | (ushort)bVar3 << 8;
              }
              local_1 = 1;
            }
          }
          local_50 = 1;
          LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x18a104);
        }
        else {
          lVar5 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)lVar5 < 1) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                   ,0x143,"StreamProcessDataSBSLine",logDEBUG,"ADS-B hex id was empty");
          }
          local_1 = 0;
          local_50 = 1;
        }
      }
    }
  }
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool ADSBHubConnection::StreamProcessDataSBSLine (const char* pStart, const char* pEnd)
{
    // Line must start with 'MSG', otherwise we ignore
    std::string token = readToken(pStart, pEnd);
    if (token != "MSG") {
        LOG_MSG(logDEBUG, "Ignoring line of type '%s'", token.c_str());
        return false;
    }
    
    // Ignore 3 fields (transmission type, session ID, aircraft id)
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    TEST_END("not even read an ADS-B hex id yet");
    
    // Read the ADS-B hex id
    token = readToken(pStart, pEnd);
    TEST_END("just only read an ADS-B hex id");
    if (token.empty()) {
        LOG_MSG(logDEBUG, "ADS-B hex id was empty");
        return false;
    }
    LTFlightData::FDKeyTy key (LTFlightData::KEY_ICAO, token);
    
    // Change of plane? Then process previous data first before continuing
    if (fdKey != key) {
        ProcessPlaneData();
        // New plane
        fdKey = key;
    }
    
    // Skip over FlightID and date/time message created
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    TEST_END("not yet read date/time of message created");
    
    // Date/time message logged
    std::tm tm;
    memset(&tm, 0, sizeof(tm));
    tm.tm_isdst = -1;               // re-lookup DST info
    tm.tm_year = std::stoi(readToken(pStart, pEnd, '/')) - 1900;
    tm.tm_mon  = std::stoi(readToken(pStart, pEnd, '/')) - 1;
    tm.tm_mday = std::stoi(readToken(pStart, pEnd));
    tm.tm_hour = std::stoi(readToken(pStart, pEnd, ':'));
    tm.tm_min  = std::stoi(readToken(pStart, pEnd, ':'));
    tm.tm_sec  = std::stoi(readToken(pStart, pEnd, '.'));
    int ms     = std::stoi(readToken(pStart, pEnd));
    TEST_END("not yet read actual data");
    time_t ts = mktime_utc(tm);
    pos.ts() = dyn.ts = double(ts) + double(ms) / 1000.0;
    
    // Call sign
    if (!(token = readToken(pStart, pEnd)).empty())
        stat.call = token;
    
    // Altitude, supposingly "HAE" = Height above ellipsoid
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.SetAltFt(std::stod(token));

    // Ground Speed
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.spd = std::stod(token);
    
    // Track (it is not heading...but best we have, we don't get heading)
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.heading() = dyn.heading = std::stod(token);
    
    // Latitude, Longitude
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.lat() = std::stod(token);
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.lon() = std::stod(token);

    // VSI
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.vsi = std::stod(token);

    // Squawk
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.radar.code = std::stol(token);

    // Skip over Alert, Emergency, SPI flags
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);

    // Ground flag
    if (!(token = readToken(pStart, pEnd)).empty()) {
        dyn.gnd = token == "1";
        pos.f.onGrnd = dyn.gnd ? GND_ON : GND_OFF;
    }
    
    return true;
}